

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except-gcc.cpp
# Opt level: O1

void __thiscall
pending_exception_info::make
          (pending_exception_info *this,__cxa_eh_globals *state_in,_Unwind_Exception *exc_in,
          bool rethrow_in)

{
  uint uVar1;
  undefined4 uVar2;
  
  this->active = exc_in;
  this->rethrow = rethrow_in;
  uVar1 = state_in->uncaughtExceptions;
  uVar2 = *(undefined4 *)&state_in->field_0xc;
  (this->runtime_state).caughtExceptions = state_in->caughtExceptions;
  (this->runtime_state).uncaughtExceptions = uVar1;
  *(undefined4 *)&(this->runtime_state).field_0xc = uVar2;
  state_in->caughtExceptions = (__cxa_exception *)0x0;
  state_in->uncaughtExceptions = 0;
  return;
}

Assistant:

void pending_exception_info::make(__cxa_eh_globals *state_in,
                                  _Unwind_Exception *exc_in, bool rethrow_in)
{
    active = exc_in;
    rethrow = rethrow_in;
    runtime_state = *state_in;
    /* Read and clear C++ runtime state.  */
    state_in->caughtExceptions = 0;
    state_in->uncaughtExceptions = 0;
#if CILK_LIB_DEBUG
    check();
#endif
}